

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ParseMatrix(AsciiParser *this,matrix3d *result)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  long *plVar6;
  size_type *psVar7;
  char cVar8;
  ulong __val;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> content;
  string __str;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  long *local_48;
  uint local_40;
  long local_38 [2];
  
  bVar2 = Expect(this,'(');
  if (!bVar2) {
    return false;
  }
  local_a8.super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = SepBy1TupleType<double,3ul>(this,',',&local_a8);
  if (bVar2) {
    if ((long)local_a8.
              super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_a8.
              super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x48) {
      bVar2 = Expect(this,')');
      if (bVar2) {
        lVar3 = 0x10;
        do {
          *(undefined8 *)((long)(result->m + -1) + 8 + lVar3) =
               *(undefined8 *)
                ((long)(local_a8.
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar3 + -0x10);
          *(undefined8 *)((long)(result->m + -1) + 0x10 + lVar3) =
               *(undefined8 *)
                ((long)(local_a8.
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar3 + -8);
          *(undefined8 *)((long)result->m[0] + lVar3) =
               *(undefined8 *)
                ((long)(local_a8.
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar3);
          lVar3 = lVar3 + 0x18;
        } while (lVar3 != 0x58);
        bVar2 = true;
        goto LAB_0036e519;
      }
    }
    else {
      __val = ((long)local_a8.
                     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_a8.
                     super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      cVar8 = '\x01';
      if (9 < __val) {
        uVar5 = __val;
        cVar1 = '\x04';
        do {
          cVar8 = cVar1;
          if (uVar5 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_0036e3dc;
          }
          if (uVar5 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_0036e3dc;
          }
          if (uVar5 < 10000) goto LAB_0036e3dc;
          bVar2 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          cVar1 = cVar8 + '\x04';
        } while (bVar2);
        cVar8 = cVar8 + '\x01';
      }
LAB_0036e3dc:
      local_48 = local_38;
      ::std::__cxx11::string::_M_construct((ulong)&local_48,cVar8);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_48,local_40,__val);
      plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x3b1098);
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_78 = *plVar6;
        lStack_70 = plVar4[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar6;
        local_88 = (long *)*plVar4;
      }
      local_80 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_88);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_68.field_2._M_allocated_capacity = *psVar7;
        local_68.field_2._8_8_ = plVar4[3];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar7;
        local_68._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_68._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      PushError(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,local_78 + 1);
      }
      if (local_48 != local_38) {
        operator_delete(local_48,local_38[0] + 1);
      }
    }
  }
  bVar2 = false;
  if (local_a8.
      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl
      .super__Vector_impl_data._M_start == (pointer)0x0) {
    return false;
  }
LAB_0036e519:
  operator_delete(local_a8.
                  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_a8.
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_a8.
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  return bVar2;
}

Assistant:

bool AsciiParser::ParseMatrix(value::matrix3d *result) {

  if (!Expect('(')) {
    return false;
  }

  std::vector<std::array<double, 3>> content;
  if (!SepBy1TupleType<double, 3>(',', &content)) {
    return false;
  }

  if (content.size() != 3) {
    PushError("# of rows in matrix3d must be 3, but got " +
              std::to_string(content.size()) + "\n");
    return false;
  }

  if (!Expect(')')) {
    return false;
  }

  for (size_t i = 0; i < 3; i++) {
    result->m[i][0] = content[i][0];
    result->m[i][1] = content[i][1];
    result->m[i][2] = content[i][2];
  }

  return true;
}